

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBoxCollision.h
# Opt level: O1

void __thiscall
cbtAABB::cbtAABB(cbtAABB *this,cbtVector3 *V1,cbtVector3 *V2,cbtVector3 *V3,cbtScalar margin)

{
  cbtScalar cVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  bool bVar6;
  cbtScalar *pcVar7;
  cbtVector3 *pcVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  auVar3 = vminss_avx(ZEXT416((uint)V3->m_floats[0]),ZEXT416((uint)V2->m_floats[0]));
  auVar3 = vminss_avx(auVar3,ZEXT416((uint)V1->m_floats[0]));
  (this->m_min).m_floats[0] = auVar3._0_4_;
  pcVar8 = V2;
  if (V3->m_floats[1] < V2->m_floats[1]) {
    pcVar8 = V3;
  }
  auVar4 = vminss_avx(ZEXT416((uint)V3->m_floats[1]),ZEXT416((uint)V2->m_floats[1]));
  uVar5 = vcmpss_avx512f(ZEXT416((uint)V1->m_floats[1]),ZEXT416((uint)pcVar8->m_floats[1]),0xe);
  bVar6 = (bool)((byte)uVar5 & 1);
  fVar9 = (float)((uint)bVar6 * auVar4._0_4_ + (uint)!bVar6 * (int)V1->m_floats[1]);
  (this->m_min).m_floats[1] = fVar9;
  pcVar8 = V2;
  if (V3->m_floats[2] < V2->m_floats[2]) {
    pcVar8 = V3;
  }
  auVar4 = vminss_avx(ZEXT416((uint)V3->m_floats[2]),ZEXT416((uint)V2->m_floats[2]));
  uVar5 = vcmpss_avx512f(ZEXT416((uint)V1->m_floats[2]),ZEXT416((uint)pcVar8->m_floats[2]),0xe);
  bVar6 = (bool)((byte)uVar5 & 1);
  fVar10 = (float)((uint)bVar6 * auVar4._0_4_ + (uint)!bVar6 * (int)V1->m_floats[2]);
  (this->m_min).m_floats[2] = fVar10;
  auVar4 = vmaxss_avx(ZEXT416((uint)V3->m_floats[0]),ZEXT416((uint)V2->m_floats[0]));
  auVar4 = vmaxss_avx(auVar4,ZEXT416((uint)V1->m_floats[0]));
  (this->m_max).m_floats[0] = auVar4._0_4_;
  pcVar8 = V2;
  if (V2->m_floats[1] < V3->m_floats[1]) {
    pcVar8 = V3;
  }
  auVar2 = vmaxss_avx(ZEXT416((uint)V3->m_floats[1]),ZEXT416((uint)V2->m_floats[1]));
  uVar5 = vcmpss_avx512f(ZEXT416((uint)V1->m_floats[1]),ZEXT416((uint)pcVar8->m_floats[1]),1);
  bVar6 = (bool)((byte)uVar5 & 1);
  fVar11 = (float)((uint)bVar6 * auVar2._0_4_ + (uint)!bVar6 * (int)V1->m_floats[1]);
  (this->m_max).m_floats[1] = fVar11;
  cVar1 = V1->m_floats[2];
  pcVar7 = V2->m_floats;
  if (pcVar7[2] < V3->m_floats[2]) {
    V2 = V3;
  }
  auVar2 = vmaxss_avx(ZEXT416((uint)V3->m_floats[2]),ZEXT416((uint)pcVar7[2]));
  uVar5 = vcmpss_avx512f(ZEXT416((uint)cVar1),ZEXT416((uint)V2->m_floats[2]),1);
  bVar6 = (bool)((byte)uVar5 & 1);
  (this->m_min).m_floats[0] = auVar3._0_4_ - margin;
  (this->m_min).m_floats[1] = fVar9 - margin;
  (this->m_min).m_floats[2] = fVar10 - margin;
  (this->m_max).m_floats[0] = auVar4._0_4_ + margin;
  (this->m_max).m_floats[1] = fVar11 + margin;
  (this->m_max).m_floats[2] =
       (float)((uint)bVar6 * auVar2._0_4_ + (uint)!bVar6 * (int)cVar1) + margin;
  return;
}

Assistant:

cbtAABB(const cbtVector3 &V1,
		   const cbtVector3 &V2,
		   const cbtVector3 &V3,
		   cbtScalar margin)
	{
		m_min[0] = BT_MIN3(V1[0], V2[0], V3[0]);
		m_min[1] = BT_MIN3(V1[1], V2[1], V3[1]);
		m_min[2] = BT_MIN3(V1[2], V2[2], V3[2]);

		m_max[0] = BT_MAX3(V1[0], V2[0], V3[0]);
		m_max[1] = BT_MAX3(V1[1], V2[1], V3[1]);
		m_max[2] = BT_MAX3(V1[2], V2[2], V3[2]);

		m_min[0] -= margin;
		m_min[1] -= margin;
		m_min[2] -= margin;
		m_max[0] += margin;
		m_max[1] += margin;
		m_max[2] += margin;
	}